

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CascRootFile_MNDX.cpp
# Opt level: O1

PMNDX_PACKAGE __thiscall
TRootHandler_MNDX::FindMndxPackage(TRootHandler_MNDX *this,char *szFileName)

{
  size_t sVar1;
  ulong __n;
  int iVar2;
  size_t sVar3;
  PMNDX_PACKAGE p_Var4;
  ulong uVar5;
  size_t sVar6;
  PMNDX_PACKAGE p_Var7;
  
  sVar3 = strlen(szFileName);
  sVar6 = (this->Packages).m_ItemCount;
  if (sVar6 == 0) {
    __assert_fail("Packages.ItemCount() != 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Qartar[P]CascLibPlus/lib/CascLib/src/CascRootFile_MNDX.cpp"
                  ,0xa82,"PMNDX_PACKAGE TRootHandler_MNDX::FindMndxPackage(const char *)");
  }
  p_Var4 = (PMNDX_PACKAGE)(this->Packages).m_pItemArray;
  sVar1 = (this->Packages).m_ItemSize;
  p_Var7 = (PMNDX_PACKAGE)0x0;
  uVar5 = 0;
  do {
    __n = p_Var4->nLength;
    if (((__n < sVar3) && (uVar5 < __n)) &&
       (iVar2 = strncmp(szFileName,p_Var4->szFileName,__n), iVar2 == 0)) {
      uVar5 = __n;
      p_Var7 = p_Var4;
    }
    p_Var4 = (PMNDX_PACKAGE)((long)&p_Var4->szFileName + sVar1);
    sVar6 = sVar6 - 1;
  } while (sVar6 != 0);
  return p_Var7;
}

Assistant:

PMNDX_PACKAGE FindMndxPackage(const char * szFileName)
    {
        PMNDX_PACKAGE pMatching = NULL;
        size_t nMaxLength = 0;
        size_t nLength = strlen(szFileName);

        // Packages must be loaded
        assert(Packages.ItemCount() != 0);

        //FILE * fp = fopen("E:\\packages.txt", "wt");
        //for(size_t i = 0; i < hs->pPackages->NameEntries; i++, pPackage++)
        //{
        //    if(pPackage->szFileName != NULL)
        //        fprintf(fp, "%s\n", pPackage->szFileName);
        //}
        //fclose(fp);

        // Find the longest matching name
        for(size_t i = 0; i < Packages.ItemCount(); i++)
        {
            PMNDX_PACKAGE pPackage = (PMNDX_PACKAGE)Packages.ItemAt(i);

            if(pPackage->nLength < nLength && pPackage->nLength > nMaxLength)
            {
                // Compare the package name
                if(!strncmp(szFileName, pPackage->szFileName, pPackage->nLength))
                {
                    nMaxLength = pPackage->nLength;
                    pMatching = pPackage;
                }
            }
        }

        // Give the package pointer or NULL if not found
        return pMatching;
    }